

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_helpers.h
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* winmd::reader::get_type_namespace_and_name
            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,coded_index<winmd::reader::TypeDefOrRef> *type)

{
  database *this;
  uint uVar1;
  uint32_t row;
  database *pdVar2;
  database *this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  
  uVar1 = (type->super_typed_index<winmd::reader::TypeDefOrRef>).
          super_index_base<winmd::reader::TypeDefOrRef>.m_value;
  if ((uVar1 & 3) == 1) {
    this_00 = ((type->super_typed_index<winmd::reader::TypeDefOrRef>).
               super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database;
    row = (uVar1 >> 2) - 1;
    pdVar2 = (this_00->TypeRef).super_table_base.m_database;
    uVar1 = table_base::get_value<unsigned_int>((table_base *)this_00,row,2);
    bVar3 = database::get_string(pdVar2,uVar1);
    pdVar2 = (this_00->TypeRef).super_table_base.m_database;
  }
  else {
    if ((uVar1 & 3) != 0) {
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      (__return_storage_ptr__->first)._M_len = 0;
      (__return_storage_ptr__->first)._M_str = (char *)0x0;
      return __return_storage_ptr__;
    }
    pdVar2 = ((type->super_typed_index<winmd::reader::TypeDefOrRef>).
              super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database;
    this_00 = (database *)&pdVar2->TypeDef;
    row = (uVar1 >> 2) - 1;
    this = (pdVar2->TypeDef).super_table_base.m_database;
    uVar1 = table_base::get_value<unsigned_int>((table_base *)this_00,row,2);
    bVar3 = database::get_string(this,uVar1);
    pdVar2 = (pdVar2->TypeDef).super_table_base.m_database;
  }
  uVar1 = table_base::get_value<unsigned_int>((table_base *)this_00,row,1);
  sVar4 = database::get_string(pdVar2,uVar1);
  __return_storage_ptr__->first = bVar3;
  (__return_storage_ptr__->second)._M_len = sVar4._M_len;
  (__return_storage_ptr__->second)._M_str = sVar4._M_str;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, std::string_view> get_type_namespace_and_name(coded_index<TypeDefOrRef> const& type)
    {
        if (type.type() == TypeDefOrRef::TypeDef)
        {
            auto const def = type.TypeDef();
            return { def.TypeNamespace(), def.TypeName() };
        }
        else if (type.type() == TypeDefOrRef::TypeRef)
        {
            auto const ref = type.TypeRef();
            return { ref.TypeNamespace(), ref.TypeName() };
        }
        else
        {
            XLANG_ASSERT(false);
            return {};
        }
    }